

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void cmc_(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  
  (pMyDisasm->Instruction).Category = 0x1000a;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"cmc",4);
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 0x20;
  (pMyDisasm->Operand1).Registers.special = 1;
  (pMyDisasm->Operand1).OpSize = 1;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x12].SF_;
  UVar4 = EFLAGS_TABLE[0x12].ZF_;
  UVar5 = EFLAGS_TABLE[0x12].AF_;
  UVar6 = EFLAGS_TABLE[0x12].PF_;
  UVar7 = EFLAGS_TABLE[0x12].CF_;
  UVar8 = EFLAGS_TABLE[0x12].TF_;
  UVar9 = EFLAGS_TABLE[0x12].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x12].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x12].NT_;
  UVar4 = EFLAGS_TABLE[0x12].RF_;
  UVar5 = EFLAGS_TABLE[0x12].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x12].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  return;
}

Assistant:

void __bea_callspec__ cmc_(PDISASM pMyDisasm)
{
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+FLAG_CONTROL_INSTRUCTION;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "cmc");
  #endif
  pMyDisasm->Operand1.OpType = REGISTER_TYPE;
  pMyDisasm->Operand1.Registers.type = SPECIAL_REG;
  pMyDisasm->Operand1.Registers.special = REG0;
  pMyDisasm->Operand1.OpSize = 1;
  FillFlags(pMyDisasm, 18);
  GV.EIP_++;
}